

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O1

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  BYTE **ppBVar1;
  ZSTD_strategy ZVar2;
  BYTE *pBVar3;
  void *pvVar4;
  U32 *pUVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  U32 UVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  
  pBVar3 = (ms->window).base;
  iVar10 = (int)pBVar3;
  if (0xe0000000 < (uint)((int)iend - iVar10)) {
    uVar8 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
    uVar12 = 1 << ((char)(params->cParams).chainLog - (ZSTD_lazy2 < (params->cParams).strategy) &
                  0x1fU);
    uVar6 = (int)ip - iVar10;
    uVar7 = uVar12 - 1 & uVar6;
    if (uVar7 == 0) {
      uVar7 = uVar12;
    }
    if (uVar12 <= uVar8) {
      uVar12 = uVar8;
    }
    uVar6 = uVar6 - (uVar12 + uVar7);
    (ms->window).base = pBVar3 + uVar6;
    ppBVar1 = &(ms->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar6;
    uVar7 = (ms->window).dictLimit;
    uVar12 = (ms->window).lowLimit;
    UVar9 = uVar12 - uVar6;
    if (uVar12 < uVar6 || UVar9 == 0) {
      UVar9 = 1;
    }
    (ms->window).lowLimit = UVar9;
    UVar9 = uVar7 - uVar6;
    if (uVar7 < uVar6 || UVar9 == 0) {
      UVar9 = 1;
    }
    (ms->window).dictLimit = UVar9;
    pUVar5 = &(ms->window).nbOverflowCorrections;
    *pUVar5 = *pUVar5 + 1;
    pvVar4 = ws->objectEnd;
    ws->tableValidEnd = pvVar4;
    iVar11 = 1 << ((byte)(params->cParams).hashLog & 0x1f);
    iVar10 = iVar11 + 0xf;
    if (-1 < iVar11) {
      iVar10 = iVar11;
    }
    if (0xf < iVar11) {
      pUVar5 = ms->hashTable;
      iVar13 = 0;
      iVar11 = 0;
      do {
        lVar14 = 0;
        do {
          uVar7 = pUVar5[iVar13 + lVar14];
          UVar9 = uVar7 - uVar6;
          if (uVar7 < uVar6) {
            UVar9 = 0;
          }
          pUVar5[iVar13 + lVar14] = UVar9;
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != 0x10);
        iVar13 = iVar13 + 0x10;
        iVar11 = iVar11 + 1;
      } while (iVar11 != iVar10 >> 4);
    }
    ZVar2 = (params->cParams).strategy;
    if ((ms->dedicatedDictSearch != 0) ||
       ((ZVar2 != ZSTD_fast &&
        ((2 < ZVar2 - ZSTD_greedy || (params->useRowMatchFinder != ZSTD_urm_enableRowMatchFinder))))
       )) {
      iVar11 = 1 << ((byte)(params->cParams).chainLog & 0x1f);
      iVar10 = iVar11 + 0xf;
      if (-1 < iVar11) {
        iVar10 = iVar11;
      }
      pUVar5 = ms->chainTable;
      if (ZVar2 == ZSTD_btlazy2) {
        if (0xf < iVar11) {
          iVar11 = 0;
          iVar13 = 0;
          do {
            lVar14 = 0;
            do {
              uVar7 = uVar6;
              if (pUVar5[iVar11 + lVar14] != 1) {
                uVar7 = 0;
              }
              uVar7 = uVar7 + pUVar5[iVar11 + lVar14];
              UVar9 = uVar7 - uVar6;
              if (uVar7 < uVar6) {
                UVar9 = 0;
              }
              pUVar5[iVar11 + lVar14] = UVar9;
              lVar14 = lVar14 + 1;
            } while ((int)lVar14 != 0x10);
            iVar11 = iVar11 + 0x10;
            iVar13 = iVar13 + 1;
          } while (iVar13 != iVar10 >> 4);
        }
      }
      else if (0xf < iVar11) {
        iVar11 = 0;
        iVar13 = 0;
        do {
          lVar14 = 0;
          do {
            UVar9 = pUVar5[iVar11 + lVar14] - uVar6;
            if (pUVar5[iVar11 + lVar14] < uVar6) {
              UVar9 = 0;
            }
            pUVar5[iVar11 + lVar14] = UVar9;
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 != 0x10);
          iVar11 = iVar11 + 0x10;
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar10 >> 4);
      }
    }
    if (ms->hashLog3 != 0) {
      iVar11 = 1 << ((byte)ms->hashLog3 & 0x1f);
      iVar10 = iVar11 + 0xf;
      if (-1 < iVar11) {
        iVar10 = iVar11;
      }
      if (0xf < iVar11) {
        pUVar5 = ms->hashTable3;
        iVar11 = 0;
        iVar13 = 0;
        do {
          lVar14 = 0;
          do {
            uVar7 = pUVar5[iVar11 + lVar14];
            UVar9 = uVar7 - uVar6;
            if (uVar7 < uVar6) {
              UVar9 = 0;
            }
            pUVar5[iVar11 + lVar14] = UVar9;
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 != 0x10);
          iVar11 = iVar11 + 0x10;
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar10 >> 4);
      }
    }
    if (pvVar4 < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    UVar9 = ms->nextToUpdate - uVar6;
    if (ms->nextToUpdate < uVar6) {
      UVar9 = 0;
    }
    ms->nextToUpdate = UVar9;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

MEM_STATIC U32 ZSTD_window_needOverflowCorrection(ZSTD_window_t const window,
                                                  U32 cycleLog,
                                                  U32 maxDist,
                                                  U32 loadedDictEnd,
                                                  void const* src,
                                                  void const* srcEnd)
{
    U32 const curr = (U32)((BYTE const*)srcEnd - window.base);
    if (ZSTD_WINDOW_OVERFLOW_CORRECT_FREQUENTLY) {
        if (ZSTD_window_canOverflowCorrect(window, cycleLog, maxDist, loadedDictEnd, src)) {
            return 1;
        }
    }
    return curr > ZSTD_CURRENT_MAX;
}